

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_column_reader.hpp
# Opt level: O2

string_t duckdb::StringParquetValueConversion::PlainRead<true>
                   (ByteBuffer *plain_data,ColumnReader *reader)

{
  uint uVar1;
  StringColumnReader *this;
  idx_t iVar2;
  ulong req_len;
  data_ptr_t str_data;
  string_t sVar3;
  undefined4 uStack_34;
  undefined4 uStack_30;
  undefined4 local_2c;
  
  this = ColumnReader::Cast<duckdb::StringColumnReader>(reader);
  iVar2 = this->fixed_width_string_length;
  if (iVar2 == 0) {
    uVar1 = ByteBuffer::read<unsigned_int>(plain_data);
    iVar2 = (idx_t)uVar1;
  }
  uVar1 = (uint)iVar2;
  req_len = iVar2 & 0xffffffff;
  ByteBuffer::available(plain_data,req_len);
  str_data = plain_data->ptr;
  StringColumnReader::VerifyString(this,(char *)str_data,uVar1);
  if (uVar1 < 0xd) {
    local_2c = 0;
    uStack_34 = 0;
    uStack_30 = 0;
    if (req_len == 0) {
      str_data = (data_ptr_t)0x0;
    }
    else {
      switchD_016b0717::default(&uStack_34,str_data,req_len);
      str_data = (data_ptr_t)CONCAT44(local_2c,uStack_30);
    }
  }
  else {
    uStack_34 = *(undefined4 *)str_data;
  }
  ByteBuffer::inc(plain_data,req_len);
  sVar3.value._4_1_ = (undefined1)uStack_34;
  sVar3.value._5_1_ = uStack_34._1_1_;
  sVar3.value._6_1_ = uStack_34._2_1_;
  sVar3.value._7_1_ = uStack_34._3_1_;
  sVar3.value.pointer.length = uVar1;
  sVar3.value.pointer.ptr = (char *)str_data;
  return (string_t)sVar3.value;
}

Assistant:

static string_t PlainRead(ByteBuffer &plain_data, ColumnReader &reader) {
		auto &scr = reader.Cast<StringColumnReader>();
		uint32_t str_len =
		    scr.fixed_width_string_length == 0 ? plain_data.read<uint32_t>() : scr.fixed_width_string_length;
		plain_data.available(str_len);
		auto plain_str = char_ptr_cast(plain_data.ptr);
		scr.VerifyString(plain_str, str_len);
		auto ret_str = string_t(plain_str, str_len);
		plain_data.inc(str_len);
		return ret_str;
	}